

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
* __thiscall
google::protobuf::json_internal::JsonLexer::ParseUtf8
          (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
           *__return_storage_ptr__,JsonLexer *this)

{
  JsonLocation *pJVar1;
  size_t len;
  ushort uVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  Status *this_00;
  string_view sVar8;
  char c;
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  *local_170;
  string on_heap;
  undefined1 local_148 [16];
  Status _status;
  anon_union_48_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::MaybeOwnedString>_3
  local_130;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  bool bStack_f0;
  undefined3 uStack_ef;
  int iStack_ec;
  JsonLocation *local_e8;
  Status _status_2;
  string local_a8;
  JsonLocation loc;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  
  local_170 = &__return_storage_ptr__->
               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ;
  SkipToToken((JsonLexer *)&_status);
  if (_status.rep_ == 1) {
    absl::lts_20240722::Status::~Status(&_status);
    cVar3 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
    pJVar1 = &this->json_loc_;
    if ((cVar3 == '\'') && ((this->options_).allow_legacy_syntax == false)) {
      JsonLocation::Invalid((JsonLocation *)&_status,pJVar1,0xc,"expected \'\"\'");
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOrData<absl::lts_20240722::Status,_0>(local_170,&_status);
    }
    else {
      loc.offset._0_4_ = *(undefined4 *)&pJVar1->offset;
      loc.offset._4_4_ = *(undefined4 *)((long)&(this->json_loc_).offset + 4);
      loc.line._0_4_ = (undefined4)(this->json_loc_).line;
      loc.line._4_4_ = *(undefined4 *)((long)&(this->json_loc_).line + 4);
      loc.col._0_4_ = (undefined4)(this->json_loc_).col;
      loc.col._4_4_ = *(undefined4 *)((long)&(this->json_loc_).col + 4);
      loc.path._0_4_ = *(undefined4 *)&(this->json_loc_).path;
      loc.path._4_4_ = *(int *)((long)&(this->json_loc_).path + 4);
      pcVar7 = "\'";
      if (cVar3 != '\'') {
        pcVar7 = "\"";
      }
      local_e8 = pJVar1;
      Expect((JsonLexer *)&_status,this,1,pcVar7);
      if (_status.rep_ == 1) {
        absl::lts_20240722::Status::~Status(&_status);
        on_heap._M_dataplus._M_p = (pointer)&on_heap.field_2;
        on_heap._M_string_length = 0;
        on_heap.field_2._M_local_buf[0] = '\0';
        BeginMark(&mark,this);
LAB_0028a0ff:
        do {
          ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)&_status,(size_t)this);
          _status_2 = _status;
          if (_status.rep_ != 1) {
            _status.rep_ = 0x37;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                    ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)&_status);
          if (_status_2.rep_ != 1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status_2);
LAB_0028a707:
            this_00 = &_status_2;
            goto LAB_0028a4be;
          }
          absl::lts_20240722::Status::~Status(&_status_2);
          bVar4 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
          Advance((JsonLexer *)&_status,(size_t)this);
          if (_status.rep_ != 1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status);
            goto LAB_0028a4b9;
          }
          absl::lts_20240722::Status::~Status(&_status);
          if ((bVar4 == 0x22) || (bVar4 == 0x27)) {
            if ((byte)((cVar3 == '\'') * '\x05' + 0x22U) == bVar4) {
              if (on_heap._M_string_length == 0) {
                Mark::UpToUnread((MaybeOwnedString *)&_status_2,&mark.value,1);
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)on_heap._M_dataplus._M_p == &on_heap.field_2) {
                  local_a8.field_2._8_8_ = on_heap.field_2._8_8_;
                }
                else {
                  local_a8._M_dataplus._M_p = on_heap._M_dataplus._M_p;
                }
                local_a8.field_2._M_allocated_capacity._1_7_ =
                     on_heap.field_2._M_allocated_capacity._1_7_;
                local_a8.field_2._M_local_buf[0] = on_heap.field_2._M_local_buf[0];
                local_a8._M_string_length = on_heap._M_string_length;
                on_heap._M_string_length = 0;
                on_heap.field_2._M_local_buf[0] = '\0';
                on_heap._M_dataplus._M_p = (pointer)&on_heap.field_2;
                MaybeOwnedString::MaybeOwnedString((MaybeOwnedString *)&_status_2,&local_a8);
                std::__cxx11::string::~string((string *)&local_a8);
              }
              sVar8 = MaybeOwnedString::AsView((MaybeOwnedString *)&_status_2);
              cVar3 = utf8_range::IsStructurallyValid(sVar8._M_len,sVar8._M_str);
              if (cVar3 == '\0') {
                JsonLocation::Invalid((JsonLocation *)&_status,local_e8,0x14,"Invalid UTF-8 string")
                ;
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOrData<absl::lts_20240722::Status,_0>(local_170,&_status);
                absl::lts_20240722::Status::~Status(&_status);
              }
              else {
                MaybeOwnedString::MaybeOwnedString
                          ((MaybeOwnedString *)&_status,(MaybeOwnedString *)&_status_2);
                local_f8 = (undefined4)loc.col;
                uStack_f4 = loc.col._4_4_;
                bStack_f0 = loc.path._0_1_;
                uStack_ef = loc.path._1_3_;
                iStack_ec = loc.path._4_4_;
                local_130._40_4_ = loc.offset._0_4_;
                local_130._44_4_ = loc.offset._4_4_;
                uStack_100 = (undefined4)loc.line;
                uStack_fc = loc.line._4_4_;
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                ::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                          ((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                            *)local_170);
                MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)&_status);
              }
              MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)&_status_2);
              goto LAB_0028a6c7;
            }
          }
          else {
            if (bVar4 == 0x5c) {
              if (on_heap._M_string_length == 0) {
                Mark::UpToUnread((MaybeOwnedString *)&_status,&mark.value,1);
                local_148 = (undefined1  [16])MaybeOwnedString::AsView((MaybeOwnedString *)&_status)
                ;
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&_status_2,
                           (basic_string_view<char,_std::char_traits<char>_> *)local_148,
                           (allocator<char> *)&c);
                std::__cxx11::string::operator=((string *)&on_heap,(string *)&_status_2);
                std::__cxx11::string::~string((string *)&_status_2);
                MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)&_status);
                Mark::Discard(&mark.value);
              }
              ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)&_status,(size_t)this)
              ;
              _status_2 = _status;
              if (_status.rep_ != 1) {
                _status.rep_ = 0x37;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                        ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)&_status);
              if (_status_2.rep_ != 1) {
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status_2);
                goto LAB_0028a707;
              }
              absl::lts_20240722::Status::~Status(&_status_2);
              cVar5 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
              c = cVar5;
              Advance((JsonLexer *)&_status,(size_t)this);
              if (_status.rep_ != 1) {
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status);
                goto LAB_0028a4b9;
              }
              absl::lts_20240722::Status::~Status(&_status);
              switch(cVar5) {
              case 'n':
                break;
              case 'o':
              case 'p':
              case 'q':
              case 's':
                goto switchD_0028a3cd_caseD_6f;
              case 'r':
                break;
              case 't':
                break;
              case 'u':
switchD_0028a3cd_caseD_75:
                std::__cxx11::string::resize((ulong)&on_heap);
                ParseUnicodeEscape((JsonLexer *)&_status,(char *)this);
                absl::lts_20240722::Status::Status(&_status_2,&_status);
                if (_status_2.rep_ != 1) {
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status_2);
                  absl::lts_20240722::Status::~Status(&_status_2);
LAB_0028a4b9:
                  this_00 = &_status;
LAB_0028a4be:
                  absl::lts_20240722::Status::~Status(this_00);
LAB_0028a6c7:
                  BufferingGuard::~BufferingGuard(&mark.value.guard_);
                  std::__cxx11::string::~string((string *)&on_heap);
                  return (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)local_170;
                }
                absl::lts_20240722::Status::~Status(&_status_2);
                absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::EnsureOk
                          ((StatusOrData<unsigned_long> *)&_status);
                std::__cxx11::string::resize((ulong)&on_heap);
                absl::lts_20240722::Status::~Status(&_status);
                goto LAB_0028a0ff;
              default:
                if (cVar5 != '\"') {
                  if (cVar5 == '\'') {
                    if ((this->options_).allow_legacy_syntax == false)
                    goto switchD_0028a3cd_caseD_6f;
                  }
                  else if ((((cVar5 != '/') && (cVar5 != 'f')) && (cVar5 != '\\')) && (cVar5 != 'b')
                          ) {
                    if ((cVar5 == 'U') && ((this->options_).allow_legacy_syntax == true))
                    goto switchD_0028a3cd_caseD_75;
switchD_0028a3cd_caseD_6f:
                    _status_2.rep_ = (uintptr_t)anon_var_dwarf_6a99c0;
                    absl::lts_20240722::StrFormat<char>
                              ((string *)&_status,(FormatSpec<char> *)&_status_2,&c);
                    JsonLocation::Invalid
                              ((JsonLocation *)local_148,local_e8,local_130._0_8_,_status.rep_);
                    absl::lts_20240722::internal_statusor::
                    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    ::StatusOrData<absl::lts_20240722::Status,_0>(local_170,(Status *)local_148);
                    goto LAB_0028a6b3;
                  }
                }
              }
              std::__cxx11::string::push_back((char)&on_heap);
              goto LAB_0028a0ff;
            }
            if (((byte)(bVar4 + 1) < 0x21) && ((this->options_).allow_legacy_syntax == false)) {
              _status_2.rep_ = (uintptr_t)anon_var_dwarf_6a99da;
              c = bVar4;
              absl::lts_20240722::StrFormat<unsigned_char>
                        ((string *)&_status,(FormatSpec<unsigned_char> *)&_status_2,(uchar *)&c);
              JsonLocation::Invalid((JsonLocation *)local_148,local_e8,local_130._0_8_,_status.rep_)
              ;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<absl::lts_20240722::Status,_0>(local_170,(Status *)local_148);
LAB_0028a6b3:
              absl::lts_20240722::Status::~Status((Status *)local_148);
              std::__cxx11::string::~string((string *)&_status);
              goto LAB_0028a6c7;
            }
          }
          uVar2 = 0xf;
          if ((byte)~bVar4 != 0) {
            for (; (byte)~bVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
            }
          }
          uVar6 = (uVar2 ^ 0xf) - 8;
          if (bVar4 == 0xff) {
            uVar6 = 8;
          }
          if ((4 < uVar6) || ((0x1dU >> (uVar6 & 0x1f) & 1) == 0)) {
            c = bVar4;
            JsonLocation::Invalid((JsonLocation *)&_status,local_e8,0x17,"invalid UTF-8 in string");
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<absl::lts_20240722::Status,_0>(local_170,&_status);
            goto LAB_0028a4b9;
          }
          len = *(size_t *)(&DAT_003b1bf0 + (ulong)uVar6 * 8);
          c = bVar4;
          if (on_heap._M_string_length != 0) {
            std::__cxx11::string::push_back((char)&on_heap);
          }
          ZeroCopyBufferedStream::Take
                    ((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)&_status,
                     &this->stream_,len);
          absl::lts_20240722::Status::Status(&_status_2,&_status);
          if (_status_2.rep_ != 1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status_2);
            absl::lts_20240722::Status::~Status(&_status_2);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::~StatusOrData
                      ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)&_status);
            goto LAB_0028a6c7;
          }
          absl::lts_20240722::Status::~Status(&_status_2);
          if (on_heap._M_string_length != 0) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::EnsureOk
                      ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)&_status);
            sVar8 = MaybeOwnedString::AsView(&local_130.data_);
            std::__cxx11::string::append((char *)&on_heap,(ulong)sVar8._M_str);
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::~StatusOrData
                    ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)&_status);
        } while( true );
      }
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status);
    }
  }
  else {
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOrData<const_absl::lts_20240722::Status,_0>(local_170,&_status);
  }
  absl::lts_20240722::Status::~Status(&_status);
  return (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          *)local_170;
}

Assistant:

absl::StatusOr<LocationWith<MaybeOwnedString>> JsonLexer::ParseUtf8() {
  RETURN_IF_ERROR(SkipToToken());
  // This is a non-standard extension accepted by the ESF parser that we will
  // need to accept for backwards-compat.
  bool is_single_quote = stream_.PeekChar() == '\'';
  if (!options_.allow_legacy_syntax && is_single_quote) {
    return Invalid("expected '\"'");
  }

  JsonLocation loc = json_loc_;
  RETURN_IF_ERROR(Expect(is_single_quote ? "'" : "\""));

  // on_heap is empty if we do not need to heap-allocate the string.
  std::string on_heap;
  LocationWith<Mark> mark = BeginMark();
  while (true) {
    RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

    char c = stream_.PeekChar();
    RETURN_IF_ERROR(Advance(1));
    switch (c) {
      case '"':
      case '\'': {
        if (c != (is_single_quote ? '\'' : '"')) {
          goto normal_character;
        }

        // NOTE: the 1 below clips off the " from the end of the string.
        MaybeOwnedString result = on_heap.empty()
                                      ? mark.value.UpToUnread(1)
                                      : MaybeOwnedString{std::move(on_heap)};
        if (utf8_range::IsStructurallyValid(result)) {
          return LocationWith<MaybeOwnedString>{std::move(result), loc};
        }
        return Invalid("Invalid UTF-8 string");
      }
      case '\\': {
        if (on_heap.empty()) {
          // The 1 skips over the `\`.
          on_heap = std::string(mark.value.UpToUnread(1).AsView());
          // Clang-tidy incorrectly notes this as being moved-from multiple
          // times, but it can only occur in one loop iteration. The mark is
          // destroyed only if we need to handle an escape when on_heap is
          // empty. Because this branch unconditionally pushes to on_heap, this
          // condition can never be reached in any iteration that follows it.
          // Thus, at most one move ever actually occurs.
          std::move(mark).value.Discard();
        }
        RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

        char c = stream_.PeekChar();
        RETURN_IF_ERROR(Advance(1));
        if (c == 'u' || (c == 'U' && options_.allow_legacy_syntax)) {
          // Ensure there is actual space to scribble the UTF-8 onto.
          on_heap.resize(on_heap.size() + 4);
          auto written = ParseUnicodeEscape(&on_heap[on_heap.size() - 4]);
          RETURN_IF_ERROR(written.status());
          on_heap.resize(on_heap.size() - 4 + *written);
        } else {
          char escape = ParseSimpleEscape(c, options_.allow_legacy_syntax);
          if (escape == 0) {
            return Invalid(absl::StrFormat("invalid escape char: '%c'", c));
          }
          on_heap.push_back(escape);
        }
        break;
      }
      normal_character:
      default: {
        uint8_t uc = static_cast<uint8_t>(c);
        // If people have newlines in their strings, that's their problem; it
        // is too difficult to support correctly in our location tracking, and
        // is out of spec, so users will get slightly wrong locations in errors.
        if ((uc < 0x20 || uc == 0xff) && !options_.allow_legacy_syntax) {
          return Invalid(absl::StrFormat(
              "invalid control character 0x%02x in string", uc));
        }

        // Process this UTF-8 code point. We do not need to fully validate it
        // at this stage; we just need to interpret it enough to know how many
        // bytes to read. UTF-8 is a varint encoding satisfying one of the
        // following (big-endian) patterns:
        //
        // 0b0xxxxxxx
        // 0b110xxxxx'10xxxxxx
        // 0b1110xxxx'10xxxxxx'10xxxxxx
        // 0b11110xxx'10xxxxxx'10xxxxxx'10xxxxxx
        size_t lookahead = 0;
        switch (absl::countl_one(uc)) {
          case 0:
            break;
          case 2:
            lookahead = 1;
            break;
          case 3:
            lookahead = 2;
            break;
          case 4:
            lookahead = 3;
            break;
          default:
            return Invalid("invalid UTF-8 in string");
        }

        if (!on_heap.empty()) {
          on_heap.push_back(c);
        }
        auto lookahead_bytes = stream_.Take(lookahead);
        RETURN_IF_ERROR(lookahead_bytes.status());
        if (!on_heap.empty()) {
          absl::string_view view = lookahead_bytes->AsView();
          on_heap.append(view.data(), view.size());
        }
        break;
      }
    }
  }

  return Invalid("EOF inside string");
}